

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdbloom.cc
# Opt level: O0

string * __thiscall
bloomFilter::getFilter_abi_cxx11_(string *__return_storage_ptr__,bloomFilter *this)

{
  ostream *poVar1;
  void *__ptr;
  reference pvVar2;
  int local_3c;
  int i_1;
  int local_30;
  int bit;
  int j;
  int i;
  uint8_t *tmparray;
  int bytes;
  bloomFilter *this_local;
  string *out;
  
  tmparray._4_4_ = this->mFilterBits >> 3;
  if ((this->mFilterBits & 7) != 0) {
    tmparray._4_4_ = tmparray._4_4_ + 1;
  }
  if (tmparray._4_4_ == 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "(EE) Error. Cannot allocate memory for 0 byte in ");
    poVar1 = std::operator<<(poVar1,"std::string bloomFilter::getFilter()");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    __ptr = malloc((long)(int)tmparray._4_4_);
    if (__ptr == (void *)0x0) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"(EE) Error. Cannot allocate memory for ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,tmparray._4_4_);
      poVar1 = std::operator<<(poVar1," bytes in ");
      poVar1 = std::operator<<(poVar1,"std::string bloomFilter::getFilter()");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
    else {
      for (bit = 0; bit < (int)tmparray._4_4_; bit = bit + 1) {
        *(undefined1 *)((long)__ptr + (long)bit) = 0;
        for (local_30 = 0; local_30 < 8; local_30 = local_30 + 1) {
          pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (&this->mBits,(long)(bit * 8 + local_30));
          if (*pvVar2 != '\0') {
            *(byte *)((long)__ptr + (long)bit) =
                 *(byte *)((long)__ptr + (long)bit) | (byte)(1 << ((byte)local_30 & 0x1f));
          }
        }
      }
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      for (local_3c = 0; local_3c < (int)tmparray._4_4_; local_3c = local_3c + 1) {
        bd_sprintf_append(__return_storage_ptr__,"%02lx",
                          (ulong)*(byte *)((long)__ptr + (long)local_3c));
      }
      free(__ptr);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string bloomFilter::getFilter() {
	/* extract filter as a hex string */
	int bytes = (mFilterBits / BITS_PER_BYTE);
	if (mFilterBits % BITS_PER_BYTE) {
		bytes++;
	}

	if (bytes==0) {
		std::cerr << "(EE) Error. Cannot allocate memory for 0 byte in " << __PRETTY_FUNCTION__ << std::endl;
		return std::string();
	}
	// convert to binary array.
	uint8_t *tmparray = (uint8_t *) malloc(bytes);
    
    	if (tmparray == NULL) {
            std::cerr << "(EE) Error. Cannot allocate memory for " << bytes << " bytes in " << __PRETTY_FUNCTION__ << std::endl;
            return std::string();
        }
        
	int i,j;
	
	for (i = 0; i < bytes; i++) {
		tmparray[i] = 0;
		for (j = 0; j < BITS_PER_BYTE; j++) {
			int bit = i * BITS_PER_BYTE + j;
			if (mBits[bit]) {
				tmparray[i] |= (1 << j);
			}
		}
	}

	std::string out;
	for (int i = 0; i < bytes; i++) {
		bd_sprintf_append(out, "%02lx",  (uint32_t) (tmparray)[i]);
	}

	free(tmparray);

	return out;
}